

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-view.c
# Opt level: O0

void borg_forget_view(void)

{
  int x;
  int y;
  borg_grid *ag;
  int i;
  
  if (borg_view_n != 0) {
    for (ag._4_4_ = 0; ag._4_4_ < borg_view_n; ag._4_4_ = ag._4_4_ + 1) {
      borg_grids[(int)(uint)borg_view_y[ag._4_4_]][(int)(uint)borg_view_x[ag._4_4_]].info =
           borg_grids[(int)(uint)borg_view_y[ag._4_4_]][(int)(uint)borg_view_x[ag._4_4_]].info &
           0xffdf;
    }
    borg_view_n = 0;
  }
  return;
}

Assistant:

void borg_forget_view(void)
{
    int i;

    borg_grid *ag;

    /* None to forget */
    if (!borg_view_n)
        return;

    /* Clear them all */
    for (i = 0; i < borg_view_n; i++) {
        int y = borg_view_y[i];
        int x = borg_view_x[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Forget that the grid is viewable */
        ag->info &= ~BORG_VIEW;
    }

    /* None left */
    borg_view_n = 0;
}